

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O2

void __thiscall
ON_ErrorEvent::ON_ErrorEvent
          (ON_ErrorEvent *this,Type event_type,char *file_name,uint line_number,char *function_name,
          char *description)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t i_1;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  this->m_event_type = event_type;
  this->m_reserved1 = '\0';
  this->m_reserved2 = 0;
  this->m_line_number = line_number;
  memset(&this->m_file_name,0,0x98);
  uVar1 = ON_String::Length(file_name);
  uVar7 = (ulong)(int)uVar1;
  uVar2 = ON_String::Length(function_name);
  uVar6 = (ulong)(int)uVar2;
  iVar3 = ON_String::Length(description);
  uVar5 = (ulong)iVar3;
  uVar4 = uVar6;
  if ((uVar7 - 0x7e) + uVar6 + uVar5 < 0xffffffffffffff7f) {
    if (0x20 < uVar1) {
      file_name = file_name + (uVar7 - 0x20);
      uVar7 = 0x20;
    }
    if (0x20 < uVar2 && (uVar6 - 0x7e) + uVar5 + uVar7 < 0xffffffffffffff7f) {
      uVar4 = 0x20;
      function_name = function_name + (uVar6 - 0x20);
    }
  }
  if (uVar7 == 0) {
    uVar7 = 0x20;
  }
  else {
    this->m_file_name = this->m_buffer;
    uVar6 = 0x7f;
    if (uVar7 < 0x7f) {
      uVar6 = uVar7;
    }
    for (uVar7 = 0x20; uVar7 - uVar6 != 0x20; uVar7 = uVar7 + 1) {
      this->m_buffer[uVar7 - 0x20] = file_name[uVar7 - 0x20];
    }
    if (0x9e < uVar7) goto LAB_0047eb29;
    this->m_buffer[uVar7 - 0x20] = '\0';
    uVar7 = uVar7 + 1;
  }
  if (uVar7 < 0x9f && uVar4 != 0) {
    this->m_function_name = this->m_buffer + (uVar7 - 0x20);
    uVar6 = 0;
    for (; (uVar6 < uVar4 && (uVar7 < 0x9f)); uVar7 = uVar7 + 1) {
      this->m_buffer[uVar7 - 0x20] = function_name[uVar6];
      uVar6 = uVar6 + 1;
    }
    if (0x9e < uVar7) goto LAB_0047eb29;
    this->m_buffer[uVar7 - 0x20] = '\0';
    uVar7 = uVar7 + 1;
  }
  if ((iVar3 != 0) && (uVar7 < 0x9f)) {
    this->m_description = this->m_buffer + (uVar7 - 0x20);
    uVar4 = 0;
    for (; (uVar4 < uVar5 && (uVar7 < 0x9f)); uVar7 = uVar7 + 1) {
      this->m_buffer[uVar7 - 0x20] = description[uVar4];
      uVar4 = uVar4 + 1;
    }
    if (uVar7 < 0x9f) {
      this->m_buffer[uVar7 - 0x20] = '\0';
    }
  }
LAB_0047eb29:
  this->m_buffer[0x7f] = '\0';
  return;
}

Assistant:

ON_ErrorEvent::ON_ErrorEvent(
  ON_ErrorEvent::Type event_type,
  const char* file_name,
  unsigned int line_number,
  const char* function_name,
  const char* description
)
  : m_event_type(event_type)
  , m_line_number(line_number)
{
  const size_t buffer_capacity = sizeof(m_buffer) / sizeof(m_buffer[0]);
  size_t file_name_length = ON_String::Length(file_name);
  size_t function_name_length = ON_String::Length(function_name);
  size_t description_length = ON_String::Length(description);
  if (file_name_length + function_name_length + description_length + 3 > buffer_capacity)
  {
    const size_t cap = buffer_capacity / 4;
    if (file_name_length > cap )
    {
      file_name += (file_name_length - cap);
      file_name_length = cap;
    }
    if (file_name_length + function_name_length + description_length + 3 > buffer_capacity)
    {
      if (function_name_length > cap)
      {
        function_name += (function_name_length - cap);
        function_name_length = cap;
      }
    }
  }

  char* c = m_buffer;
  char* c1 = m_buffer + (buffer_capacity - 1);

  if (file_name_length > 0 && c < c1)
  {
    m_file_name = c;
    for (size_t i = 0; i < file_name_length && c < c1; i++)
      *c++ = file_name[i];
    if (c < c1)
      *c++ = 0;
  }

  if (function_name_length > 0 && c < c1)
  {
    m_function_name = c;
    for (size_t i = 0; i < function_name_length && c < c1; i++)
      *c++ = function_name[i];
    if (c < c1)
      *c++ = 0;
  }

  if (description_length > 0 && c < c1)
  {
    m_description = c;
    for (size_t i = 0; i < description_length && c < c1; i++)
      *c++ = description[i];
    if (c < c1)
      *c++ = 0;
  }

  *c1 = 0;
}